

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O0

wstring * __thiscall
mjs::number_to_radix_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int radix)

{
  bool bVar1;
  undefined1 int_part_00;
  int radix_00;
  wstring local_88;
  byte local_63;
  allocator<wchar_t> local_62;
  undefined1 local_61;
  double local_60;
  double frac_part;
  double int_part;
  allocator<wchar_t> local_1d;
  uint local_1c;
  double dStack_18;
  int radix_local;
  double x_local;
  wstring *res;
  
  local_1c = (uint)this;
  bVar1 = false;
  if ((1 < (int)local_1c) && (bVar1 = false, local_1c != 10)) {
    bVar1 = (int)local_1c < 0x25;
  }
  dStack_18 = x;
  x_local = (double)__return_storage_ptr__;
  if (bVar1) {
    bVar1 = std::isfinite(x);
    if (bVar1) {
      if ((dStack_18 != 0.0) || (NAN(dStack_18))) {
        if (0.0 <= dStack_18) {
          int_part_00 = std::isfinite(dStack_18);
          if (!(bool)int_part_00 || dStack_18 <= 0.0) {
            __assert_fail("std::isfinite(x) && x > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                          ,0x101,"std::wstring mjs::number_to_radix_string(double, int)");
          }
          frac_part = floor(dStack_18);
          local_60 = dStack_18 - frac_part;
          local_61 = 0;
          local_63 = 0;
          if ((frac_part != 0.0) || (NAN(frac_part))) {
            (anonymous_namespace)::to_radix_string_inner_abi_cxx11_
                      (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)local_1c,frac_part,1,
                       (bool)int_part_00);
          }
          else {
            std::allocator<wchar_t>::allocator();
            local_63 = 1;
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                      ((wstring *)__return_storage_ptr__,L"0",&local_62);
          }
          if ((local_63 & 1) != 0) {
            std::allocator<wchar_t>::~allocator(&local_62);
          }
          if ((local_60 != 0.0) || (NAN(local_60))) {
            std::__cxx11::wstring::operator+=((wstring *)__return_storage_ptr__,L'.');
            (anonymous_namespace)::to_radix_string_inner_abi_cxx11_
                      (&local_88,(_anonymous_namespace_ *)(ulong)local_1c,local_60,0,
                       (bool)int_part_00);
            std::__cxx11::wstring::operator+=
                      ((wstring *)__return_storage_ptr__,(wstring *)&local_88);
            std::__cxx11::wstring::~wstring((wstring *)&local_88);
          }
        }
        else {
          number_to_radix_string_abi_cxx11_
                    ((wstring *)&int_part,(mjs *)(ulong)local_1c,-dStack_18,radix_00);
          std::operator+(__return_storage_ptr__,L"-",(wstring *)&int_part);
          std::__cxx11::wstring::~wstring((wstring *)&int_part);
        }
      }
      else {
        std::allocator<wchar_t>::allocator();
        std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                  ((wstring *)__return_storage_ptr__,L"0",&local_1d);
        std::allocator<wchar_t>::~allocator(&local_1d);
      }
    }
    else {
      number_to_string_abi_cxx11_(__return_storage_ptr__,this,dStack_18);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("radix >= 2 && radix != 10 && radix <= 36",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                ,0xf9,"std::wstring mjs::number_to_radix_string(double, int)");
}

Assistant:

std::wstring number_to_radix_string(double x, int radix) {
    assert(radix >= 2 && radix != 10 && radix <= 36);
    if (!std::isfinite(x)) {
        return number_to_string(x);
    } else if (x == 0.0) {
        return L"0";
    } else if (x < 0) {
        return L"-" + number_to_radix_string(-x, radix);
    }
    assert(std::isfinite(x) && x > 0);

    const double int_part  = std::floor(x);
    const double frac_part = x - int_part;

    auto res = int_part ? to_radix_string_inner(int_part, radix, true) : L"0";
    if (frac_part != 0.0) {
        res += '.';
        res += to_radix_string_inner(frac_part, radix, false);
    }

    return res;

}